

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDec07.c
# Opt level: O2

word If_Dec5Perform(word t,int fDerive)

{
  byte bVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  ulong uVar6;
  word wVar7;
  byte bVar8;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  uint uVar12;
  uint uVar13;
  bool bVar14;
  word C;
  int Pla2Var [7];
  word D;
  word local_d0;
  uint local_c4;
  int *local_c0;
  word D2 [4];
  word C2 [4];
  word local_68;
  word local_60;
  int Var2Pla [7];
  
  for (lVar5 = 0; lVar5 != 7; lVar5 = lVar5 + 1) {
    Var2Pla[lVar5] = (int)lVar5;
    Pla2Var[lVar5] = (int)lVar5;
  }
  iVar3 = 0;
  local_d0 = t;
  do {
    uVar6 = 0xffffffffffffffff;
    if (iVar3 == 5) {
      return 0;
    }
    t = If_Dec6MoveTo(t,iVar3,0,Pla2Var,Var2Pla);
    while (uVar6 != 5) {
      lVar5 = uVar6 + 1;
      uVar6 = uVar6 + 1;
      if (uVar6 != (uint)Pla2Var[Var2Pla[lVar5]]) {
        __assert_fail("Pla2Var[Var2Pla[i]] == i",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDec07.c"
                      ,0x1a2,"void If_DecVerifyPerm(int *, int *)");
      }
    }
    uVar2 = 0;
    while (uVar13 = uVar2, uVar13 != 4) {
      uVar9 = uVar13;
      for (uVar12 = uVar13 + 1; uVar2 = uVar13 + 1, uVar12 != 4; uVar12 = uVar12 + 1) {
        local_60 = local_d0;
        uVar6 = 0;
        do {
          uVar2 = (uint)uVar6;
          bVar8 = (byte)uVar13;
          if (uVar2 == 4) {
            if (fDerive == 0) {
              return 1;
            }
            D2[2] = 0;
            D2[3] = 0;
            D2[0] = 0;
            D2[1] = 0;
            for (uVar2 = 0;
                (uVar10 = 0xffffffff, uVar2 != 4 &&
                (uVar10 = uVar2, uVar13 == uVar2 || uVar12 == uVar2)); uVar2 = uVar2 + 1) {
            }
            local_c4 = 1;
            local_c0 = Pla2Var + 2;
            do {
              if (local_c4 == 4) {
LAB_00378061:
                __assert_fail("zz1 != -1 && zz2 != -1",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDec07.c"
                              ,0x2d0,"word If_Dec5CofCount2(word, int, int, int *, word, int)");
              }
              bVar14 = uVar9 != 0;
              uVar9 = uVar9 - 1;
              if (((uVar10 != local_c4) && (uVar13 != local_c4)) && (bVar14)) {
                if (uVar10 == 0xffffffff) goto LAB_00378061;
                for (uVar6 = 0; uVar6 != 4; uVar6 = uVar6 + 1) {
                  uVar9 = (uint)(uVar6 >> 1) & 0x7fffffff;
                  bVar1 = 0;
                  uVar2 = 0;
                  for (lVar5 = 0; lVar5 != 0x10; lVar5 = lVar5 + 1) {
                    if (((((uint)lVar5 >> (bVar8 & 0x1f) ^ (uint)uVar6) & 1) == 0) &&
                       ((((uint)lVar5 >> (uVar12 & 0x1f) & 1) != 0) == uVar9)) {
                      uVar2 = uVar2 | 1 << ((byte)(t >> (bVar1 & 0x3f)) & 3);
                    }
                    bVar1 = bVar1 + 2;
                  }
                  uVar11 = (ulong)uVar2;
                  if (BitCount8[uVar2 & 0xf] == 2) {
                    uVar2 = Abc_Tt6FirstBit(uVar11);
                    iVar3 = Abc_Tt6FirstBit(uVar11 ^ 1L << ((ulong)uVar2 & 0x3f));
                    C2[uVar6] = *(ulong *)(&DAT_007d58b0 + (long)(int)uVar2 * 8) &
                                0x3333333333333333 |
                                *(ulong *)(&DAT_007d58b0 + (long)iVar3 * 8) & 0xcccccccccccccccc;
                    bVar1 = 0;
                    for (lVar5 = 0; lVar5 != 0x10; lVar5 = lVar5 + 1) {
                      uVar2 = (uint)lVar5;
                      if (((((uVar2 >> (bVar8 & 0x1f) ^ (uint)uVar6) & 1) == 0) &&
                          (((uVar2 >> (uVar12 & 0x1f) & 1) != 0) == uVar9)) &&
                         ((ulong)((uint)(t >> (bVar1 & 0x3f)) & 3) == (long)iVar3)) {
                        D2[uVar6] = D2[uVar6] |
                                    1L << ((uVar2 >> (uVar10 & 0x1f) & 1) != 0) +
                                          ((byte)(uVar2 >> ((byte)local_c4 & 0x1f)) & 1) * '\x02';
                      }
                      bVar1 = bVar1 + 2;
                    }
                    wVar7 = (ulong)((uint)D2[uVar6] & 0xf) * 0x1111111111111111;
                  }
                  else {
                    if (BitCount8[uVar2 & 0xf] != 1) {
                      __assert_fail("0",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDec07.c"
                                    ,0x2e9,"word If_Dec5CofCount2(word, int, int, int *, word, int)"
                                   );
                    }
                    iVar3 = Abc_Tt6FirstBit(uVar11);
                    C2[uVar6] = *(word *)(&DAT_007d58b0 + (long)iVar3 * 8);
                    wVar7 = 0xffffffffffffffff;
                  }
                  D2[uVar6] = wVar7;
                }
                C = C2[1] & 0xf000f000f000f0 | C2[3] & 0xf000f000f000f000 |
                    C2[0] & 0xf000f000f000f | C2[2] & 0xf000f000f000f00;
                D = D2[1] & 0xf000f000f000f0 | D2[3] & 0xf000f000f000f000 |
                    D2[0] & 0xf000f000f000f | D2[2] & 0xf000f000f000f00;
                iVar3 = Abc_TtHasVar(&D,5,2);
                iVar4 = Abc_TtHasVar(&D,5,3);
                if (iVar4 == 0 || iVar3 == 0) {
                  if (iVar3 == 0 || iVar4 != 0) {
                    if (iVar4 == 0 || iVar3 != 0) {
                      uVar6 = (long)*local_c0 << 0x14 |
                              (long)Pla2Var[(long)(int)uVar10 + 1] << 0x10 | D & 0xffff | 0x66000000
                      ;
                      goto LAB_00377d6c;
                    }
                    D = D >> 4 & 0xf000f000f000f0 |
                        (D & 0xf000f000f000f0) << 4 | D & 0xf00ff00ff00ff00f;
                    uVar6 = (long)Pla2Var[(long)(int)uVar10 + 1] << 0x10 | D & 0xffff;
                    iVar3 = *local_c0;
                    iVar4 = Pla2Var[(ulong)uVar12 + 1];
                  }
                  else {
                    uVar6 = (ulong)CONCAT42(Pla2Var[(long)(int)uVar10 + 1],(undefined2)D);
                    iVar3 = *local_c0;
                    iVar4 = Pla2Var[(ulong)uVar13 + 1];
                  }
                  uVar6 = (long)iVar4 << 0x18 | (long)iVar3 << 0x14 | uVar6 | 0x60000000;
                }
                else {
                  uVar6 = (long)Pla2Var[(ulong)uVar12 + 1] << 0x1c |
                          (long)Pla2Var[(ulong)uVar13 + 1] << 0x18 | (long)*local_c0 << 0x14 |
                          (long)CONCAT42(Pla2Var[(long)(int)uVar10 + 1],(undefined2)D);
                }
LAB_00377d6c:
                iVar3 = Abc_TtHasVar(&C,5,2);
                iVar4 = Abc_TtHasVar(&C,5,3);
                if (iVar4 == 0 || iVar3 == 0) {
                  if (iVar3 == 0 || iVar4 != 0) {
                    if (iVar4 == 0 || iVar3 != 0) {
                      wVar7 = uVar6 | (ulong)(uint)Pla2Var[0] << 0x30 | (C & 0xffff) << 0x20 |
                                      0x6670000000000000;
                    }
                    else {
                      C = C >> 4 & 0xf000f000f000f0 |
                          (C & 0xf000f000f000f0) << 4 | C & 0xf00ff00ff00ff00f;
                      wVar7 = (ulong)(uint)Pla2Var[(ulong)uVar12 + 1] << 0x38 | uVar6 |
                              0x6070000000000000 |
                              (ulong)(uint)Pla2Var[0] << 0x30 | (C & 0xffff) << 0x20;
                    }
                    goto LAB_00377ebb;
                  }
                  uVar11 = (ulong)(uint)Pla2Var[(ulong)uVar13 + 1] << 0x38 |
                           (ulong)(uint)Pla2Var[0] << 0x30 | (C & 0xffff) << 0x20 |
                           0x6070000000000000;
                }
                else {
                  uVar11 = (ulong)(uint)Pla2Var[(ulong)uVar12 + 1] << 0x3c |
                           (ulong)(uint)Pla2Var[(ulong)uVar13 + 1] << 0x38 |
                           (ulong)(uint)Pla2Var[0] << 0x30 | (C & 0xffff) << 0x20 | 0x70000000000000
                  ;
                }
                wVar7 = uVar11 | uVar6;
LAB_00377ebb:
                local_68 = If_Dec6Truth(wVar7);
                if (local_68 == local_d0) {
                  return wVar7;
                }
                putchar(10);
                Kit_DsdPrintFromTruth((uint *)C2,5);
                putchar(10);
                Kit_DsdPrintFromTruth((uint *)(C2 + 1),5);
                putchar(10);
                Kit_DsdPrintFromTruth((uint *)(C2 + 2),5);
                putchar(10);
                Kit_DsdPrintFromTruth((uint *)(C2 + 3),5);
                putchar(10);
                putchar(10);
                Kit_DsdPrintFromTruth((uint *)D2,5);
                putchar(10);
                Kit_DsdPrintFromTruth((uint *)(D2 + 1),5);
                putchar(10);
                Kit_DsdPrintFromTruth((uint *)(D2 + 2),5);
                putchar(10);
                Kit_DsdPrintFromTruth((uint *)(D2 + 3),5);
                putchar(10);
                putchar(10);
                Kit_DsdPrintFromTruth((uint *)&C,5);
                putchar(10);
                Kit_DsdPrintFromTruth((uint *)&D,5);
                putchar(10);
                putchar(10);
                Kit_DsdPrintFromTruth((uint *)&local_68,5);
                putchar(10);
                Kit_DsdPrintFromTruth((uint *)&local_60,5);
                putchar(10);
                if (local_68 == local_60) {
                  return wVar7;
                }
                __assert_fail("t1 == t0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDec07.c"
                              ,0x35f,"word If_Dec5CofCount2(word, int, int, int *, word, int)");
              }
              local_c4 = local_c4 + 1;
              local_c0 = local_c0 + 1;
            } while( true );
          }
          bVar1 = 0;
          uVar10 = 0;
          for (lVar5 = 0; lVar5 != 0x10; lVar5 = lVar5 + 1) {
            if (((((uint)lVar5 >> (bVar8 & 0x1f) ^ uVar2) & 1) == 0) &&
               ((uint)(((uint)lVar5 >> (uVar12 & 0x1f) & 1) != 0) == (uint)(uVar6 >> 1))) {
              uVar10 = uVar10 | 1 << ((byte)(t >> (bVar1 & 0x3f)) & 3);
            }
            bVar1 = bVar1 + 2;
          }
          uVar6 = (ulong)(uVar2 + 1);
        } while (BitCount8[uVar10 & 0xf] < 3);
        uVar9 = uVar9 + 1;
      }
    }
    iVar3 = iVar3 + 1;
  } while( true );
}

Assistant:

word If_Dec5Perform( word t, int fDerive )
{
    int Pla2Var[7], Var2Pla[7];
    int i, j, v;
    word t0 = t;
/*
    word c0, c1, c00, c01, c10, c11;
    for ( i = 0; i < 5; i++ )
    {
        c0 = If_Dec6Cofactor( t, i, 0 );
        c1 = If_Dec6Cofactor( t, i, 1 );
        if ( c0 == 0 )
            return 1;
        if ( ~c0 == 0 )
            return 1;
        if ( c1 == 0 )
            return 1;
        if ( ~c1 == 0 )
            return 1;
       if ( c0 == ~c1 )
            return 1;
    }
    for ( i = 0; i < 4; i++ )
    {
        c0 = If_Dec6Cofactor( t, i, 0 );
        c1 = If_Dec6Cofactor( t, i, 1 );
        for ( j = i + 1; j < 5; j++ )
        {
            c00 = If_Dec6Cofactor( c0, j, 0 );
            c01 = If_Dec6Cofactor( c0, j, 1 );
            c10 = If_Dec6Cofactor( c1, j, 0 );
            c11 = If_Dec6Cofactor( c1, j, 1 );
            if ( c00 == c01 && c00 == c10 )
                return 1;
            if ( c11 == c01 && c11 == c10 )
                return 1;
            if ( c11 == c00 && c11 == c01 )
                return 1;
            if ( c11 == c00 && c11 == c10 )
                return 1;
            if ( c00 == c11 && c01 == c10 )
                return 1;
        }
    }
*/
    // start arrays
    for ( i = 0; i < 7; i++ )
        Pla2Var[i] = Var2Pla[i] = i;
    // generate permutations
    for ( v = 0; v < 5; v++ )
    {
        t = If_Dec6MoveTo( t, v, 0, Pla2Var, Var2Pla );
        If_DecVerifyPerm( Pla2Var, Var2Pla );
        for ( i = 0; i < 4; i++ )
            for ( j = i + 1; j < 4; j++ )
            {
                word z = If_Dec5CofCount2( t, i, j, Pla2Var, t0, fDerive );
                if ( z )
                {
/*
                    if ( v == 0 && i == 1 && j == 2 )
                    {
                          Kit_DsdPrintFromTruth( (unsigned *)&t, 5 ); printf( "\n" );
                    }
*/
                    return z;
                }
            }
    }

/*
    // start arrays
    for ( i = 0; i < 7; i++ )
        Pla2Var[i] = Var2Pla[i] = i;

    t = t0;
    for ( v = 0; v < 5; v++ )
    {
        int x, y;

        t = If_Dec6MoveTo( t, v, 0, Pla2Var, Var2Pla );
        If_DecVerifyPerm( Pla2Var, Var2Pla );

        for ( i = 0; i < 16; i++ )
            printf( "%d ", ((t >> (i<<1)) & 3) );
        printf( "\n" );

        for ( x = 0; x < 4; x++ )
        for ( y = x + 1; y < 4; y++ )
        {
            for ( i = 0; i < 16; i++ )
                if ( !((i >> x) & 1) && !((i >> y) & 1) )
                    printf( "%d ", ((t >> (i<<1)) & 3) );
            printf( "\n" );

            for ( i = 0; i < 16; i++ )
                if ( ((i >> x) & 1) && !((i >> y) & 1) )
                    printf( "%d ", ((t >> (i<<1)) & 3) );
            printf( "\n" );

            for ( i = 0; i < 16; i++ )
                if ( !((i >> x) & 1) && ((i >> y) & 1) )
                    printf( "%d ", ((t >> (i<<1)) & 3) );
            printf( "\n" );

            for ( i = 0; i < 16; i++ )
                if ( ((i >> x) & 1) && ((i >> y) & 1) )
                    printf( "%d ", ((t >> (i<<1)) & 3) );
            printf( "\n" );
            printf( "\n" );
        }
    }
*/

//    Kit_DsdPrintFromTruth( (unsigned *)&t, 5 ); printf( "\n" );
    return 0;
}